

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.hpp
# Opt level: O2

float __thiscall
re::beatnik::tracker<float,_256L,_4L>::estimate_period(tracker<float,_256L,_4L> *this)

{
  ring_array<long,_1024UL> *this_00;
  difference_type dVar1;
  size_type sVar2;
  size_type position;
  float local_60;
  float local_5c;
  reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> local_58;
  reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> local_48;
  ring_array<float,_1024UL> *local_38;
  long local_30;
  reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> local_28;
  
  this->counter = 0;
  local_58.current.container = &this->cumulative_score;
  local_58.current.index = 0x400;
  local_28.current.index = 0x400;
  local_30 = 0x400 - this->period_guess;
  local_38 = local_58.current.container;
  local_28.current.container = local_58.current.container;
  ::std::max_element<std::reverse_iterator<re::indexed_iterator<re::ring_array<float,1024ul>,true>>>
            (&local_48,&local_28);
  dVar1 = ::std::
          distance<std::reverse_iterator<re::indexed_iterator<re::ring_array<float,1024ul>,true>>>
                    (&local_58,&local_48);
  position = 0x3ff - dVar1;
  this_00 = &this->backlink;
  local_5c = 0.0;
  local_60 = 0.0;
  while( true ) {
    sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
    if ((long)position <= (this->backlink).c._M_elems[sVar2]) break;
    sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
    if ((this->backlink).c._M_elems[sVar2] == 0) break;
    sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
    local_5c = local_5c + (float)(this->backlink).c._M_elems[sVar2];
    local_60 = local_60 + 1.0;
    sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
    position = position - (this->backlink).c._M_elems[sVar2];
  }
  return local_5c / local_60;
}

Assistant:

T
    estimate_period() noexcept
    {
        counter = 0;

        auto max_index = static_cast<int_t>(
            std::distance(
                std::crbegin(cumulative_score),
                std::max_element(
                    std::crbegin(cumulative_score),
                    std::crbegin(cumulative_score) + period_guess
                )
            )
        );
        auto last_beat = N - max_index - 1;

        T periods_sum = 0;
        T periods_count = 0;

        // jump in reverse from a beat to another
        while (last_beat > backlink[last_beat]) {
            if (backlink[last_beat] == 0) break; // JIC
            periods_sum += backlink[last_beat];
            periods_count++;
            last_beat -= backlink[last_beat];
        }

        return periods_sum / periods_count;
    }